

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O0

int32_t __thiscall icu_63::UnifiedCache::addHardRef(UnifiedCache *this,SharedObject *value)

{
  int32_t local_1c;
  int refCount;
  SharedObject *value_local;
  UnifiedCache *this_local;
  
  local_1c = 0;
  if ((value != (SharedObject *)0x0) &&
     (local_1c = umtx_atomic_inc(&value->hardRefCount), local_1c == 1)) {
    this->fNumValuesInUse = this->fNumValuesInUse + 1;
  }
  return local_1c;
}

Assistant:

int32_t UnifiedCache::addHardRef(const SharedObject *value) const {
    int refCount = 0;
    if (value) {
        refCount = umtx_atomic_inc(&value->hardRefCount);
        U_ASSERT(refCount >= 1);
        if (refCount == 1) {
            fNumValuesInUse++;
        }
    }
    return refCount;
}